

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationSpeed.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotationSpeed::ArchiveOUT(ChLinkMotorRotationSpeed *this,ChArchiveOut *marchive)

{
  ChNameValue<bool> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkMotorRotationSpeed>(marchive);
  ChLinkMotorRotation::ArchiveOUT(&this->super_ChLinkMotorRotation,marchive);
  local_30._value = (double *)&(this->super_ChLinkMotorRotation).field_0x278;
  local_30._name = "rot_offset";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->avoid_angle_drift;
  local_48._name = "avoid_angle_drift";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChLinkMotorRotationSpeed::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkMotorRotationSpeed>();

    // serialize parent class
    ChLinkMotorRotation::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(rot_offset);
    marchive << CHNVP(avoid_angle_drift);
}